

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O3

void __thiscall cmComputeTargetDepends::ComputeIntermediateGraph(cmComputeTargetDepends *this)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  long lVar3;
  cmValue cVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar5;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_01;
  long lVar6;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *__x;
  string_view value;
  string local_58;
  long local_38;
  
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&(this->IntermediateGraph).
              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,0);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&(this->IntermediateGraph).
              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
             ((long)(this->InitialGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->InitialGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  lVar3 = (long)(this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>
                .super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>
                .super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar3 != 0) {
    local_38 = (lVar3 >> 3) * -0x5555555555555555;
    local_38 = local_38 + (ulong)(local_38 == 0);
    lVar6 = 0;
    lVar3 = 0;
    do {
      __x = (vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)
            ((long)&(((this->InitialGraph).
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_start)->
                    super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
                    super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + lVar6);
      this_01 = (vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)
                ((long)&(((this->IntermediateGraph).
                          super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                          super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                          _M_impl.super__Vector_impl_data._M_start)->
                        super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
                        super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + lVar6);
      this_00 = (this->Targets).
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar3];
      TVar2 = cmGeneratorTarget::GetType(this_00);
      if ((TVar2 == STATIC_LIBRARY) ||
         (TVar2 = cmGeneratorTarget::GetType(this_00), TVar2 == OBJECT_LIBRARY)) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"OPTIMIZE_DEPENDENCIES","");
        cVar4 = cmGeneratorTarget::GetProperty(this_00,&local_58);
        pcVar5 = extraout_RDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          pcVar5 = extraout_RDX_00;
        }
        if ((cVar4.Value == (string *)0x0) ||
           (value._M_str = pcVar5, value._M_len = (size_t)((cVar4.Value)->_M_dataplus)._M_p,
           bVar1 = cmValue::IsOn((cmValue *)(cVar4.Value)->_M_string_length,value), !bVar1)) {
          std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::operator=(this_01,__x);
        }
        else {
          OptimizeLinkDependencies(this,this_00,(cmGraphEdgeList *)this_01,(cmGraphEdgeList *)__x);
        }
      }
      else {
        std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::operator=(this_01,__x);
      }
      lVar3 = lVar3 + 1;
      lVar6 = lVar6 + 0x18;
    } while (local_38 != lVar3);
  }
  return;
}

Assistant:

void cmComputeTargetDepends::ComputeIntermediateGraph()
{
  this->IntermediateGraph.resize(0);
  this->IntermediateGraph.resize(this->InitialGraph.size());

  size_t n = this->InitialGraph.size();
  for (size_t i = 0; i < n; ++i) {
    auto const& initialEdges = this->InitialGraph[i];
    auto& intermediateEdges = this->IntermediateGraph[i];
    cmGeneratorTarget const* gt = this->Targets[i];
    if (gt->GetType() != cmStateEnums::STATIC_LIBRARY &&
        gt->GetType() != cmStateEnums::OBJECT_LIBRARY) {
      intermediateEdges = initialEdges;
    } else {
      if (cmValue optimizeDependencies =
            gt->GetProperty("OPTIMIZE_DEPENDENCIES")) {
        if (optimizeDependencies.IsOn()) {
          this->OptimizeLinkDependencies(gt, intermediateEdges, initialEdges);
        } else {
          intermediateEdges = initialEdges;
        }
      } else {
        intermediateEdges = initialEdges;
      }
    }
  }
}